

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

string_view __thiscall csv::CSVRow::get_field(CSVRow *this,size_t index)

{
  bool bVar1;
  size_t sVar2;
  runtime_error *this_00;
  element_type *peVar3;
  mapped_type *this_01;
  ulong uVar4;
  const_reference pvVar5;
  reference pvVar6;
  string_view sVar7;
  ulong local_80;
  size_t i;
  bool prev_ch_quote;
  mapped_type *value;
  char *local_60;
  undefined1 local_58 [8];
  basic_string_view<char,_std::char_traits<char>_> field_str;
  RawCSVField *field;
  size_t field_index;
  size_t local_28;
  size_t index_local;
  CSVRow *this_local;
  char *local_10;
  
  local_28 = index;
  index_local = (size_t)this;
  sVar2 = size(this);
  if (sVar2 <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  field = (RawCSVField *)(this->fields_start + local_28);
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  field_str._M_str = (char *)internals::CSVFieldList::operator[](&peVar3->fields,(size_t)field);
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  value = (mapped_type *)(peVar3->data)._M_len;
  local_60 = (peVar3->data)._M_str;
  _local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&value,
                         this->data_start + *(long *)field_str._M_str,0xffffffffffffffff);
  if ((field_str._M_str[0x10] & 1U) == 0) {
    _this_local = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_58,0,
                             *(size_type *)(field_str._M_str + 8));
  }
  else {
    peVar3 = std::
             __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    this_01 = std::
              unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar3->double_quote_fields,(key_type *)&field);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      bVar1 = false;
      for (local_80 = 0; local_80 < *(ulong *)(field_str._M_str + 8); local_80 = local_80 + 1) {
        peVar3 = std::
                 __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_58,local_80);
        pvVar6 = std::array<csv::internals::ParseFlags,_256UL>::operator[]
                           (&peVar3->parse_flags,(long)(*pvVar5 + 0x80));
        if (*pvVar6 == QUOTE) {
          if (!bVar1) {
            bVar1 = true;
            goto LAB_0011e28d;
          }
          bVar1 = false;
        }
        else {
LAB_0011e28d:
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_58,local_80)
          ;
          std::__cxx11::string::operator+=((string *)this_01,*pvVar5);
        }
      }
    }
    _this_local = (basic_string_view<char,_std::char_traits<char>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
  }
  sVar7._M_len = (size_t)this_local;
  sVar7._M_str = local_10;
  return sVar7;
}

Assistant:

CSV_INLINE csv::string_view CSVRow::get_field(size_t index) const
    {
        using internals::ParseFlags;

        if (index >= this->size())
            throw std::runtime_error("Index out of bounds.");

        const size_t field_index = this->fields_start + index;
        auto& field = this->data->fields[field_index];
        auto field_str = csv::string_view(this->data->data).substr(this->data_start + field.start);

        if (field.has_double_quote) {
            auto& value = this->data->double_quote_fields[field_index];
            if (value.empty()) {
                bool prev_ch_quote = false;
                for (size_t i = 0; i < field.length; i++) {
                    if (this->data->parse_flags[field_str[i] + 128] == ParseFlags::QUOTE) {
                        if (prev_ch_quote) {
                            prev_ch_quote = false;
                            continue;
                        }
                        else {
                            prev_ch_quote = true;
                        }
                    }

                    value += field_str[i];
                }
            }

            return csv::string_view(value);
        }

        return field_str.substr(0, field.length);
    }